

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  int iVar1;
  Vdbe *v_00;
  yColCache *local_48;
  yColCache *p;
  int i;
  Vdbe *v;
  u8 p5_local;
  int iReg_local;
  int iTable_local;
  int iColumn_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  v_00 = pParse->pVdbe;
  p._4_4_ = 0;
  local_48 = pParse->aColCache;
  while( true ) {
    if ((int)(uint)pParse->nColCache <= p._4_4_) {
      sqlite3ExprCodeGetColumnOfTable(v_00,pTab,iTable,iColumn,iReg);
      if (p5 == '\0') {
        sqlite3ExprCacheStore(pParse,iTable,iColumn,iReg);
      }
      else {
        sqlite3VdbeChangeP5(v_00,(ushort)p5);
      }
      return iReg;
    }
    if ((local_48->iTable == iTable) && (local_48->iColumn == iColumn)) break;
    p._4_4_ = p._4_4_ + 1;
    local_48 = local_48 + 1;
  }
  iVar1 = pParse->iCacheCnt;
  pParse->iCacheCnt = iVar1 + 1;
  local_48->lru = iVar1;
  sqlite3ExprCachePinRegister(pParse,local_48->iReg);
  return local_48->iReg;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct yColCache *p;

  for(i=0, p=pParse->aColCache; i<pParse->nColCache; i++, p++){
    if( p->iTable==iTable && p->iColumn==iColumn ){
      p->lru = pParse->iCacheCnt++;
      sqlite3ExprCachePinRegister(pParse, p->iReg);
      return p->iReg;
    }
  }  
  assert( v!=0 );
  sqlite3ExprCodeGetColumnOfTable(v, pTab, iTable, iColumn, iReg);
  if( p5 ){
    sqlite3VdbeChangeP5(v, p5);
  }else{   
    sqlite3ExprCacheStore(pParse, iTable, iColumn, iReg);
  }
  return iReg;
}